

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

int ON_CompareKnotVector
              (int orderA,int cv_countA,double *knotA,int orderB,int cv_countB,double *knotB)

{
  bool bVar1;
  double dVar2;
  double local_78;
  double local_70;
  double tol;
  double ktol;
  double btol;
  double atol;
  double b;
  double a;
  int i;
  int knot_count;
  double *knotB_local;
  int cv_countB_local;
  int orderB_local;
  double *knotA_local;
  int local_10;
  int cv_countA_local;
  int orderA_local;
  
  _i = knotB;
  knotB_local._0_4_ = cv_countB;
  knotB_local._4_4_ = orderB;
  _cv_countB_local = knotA;
  knotA_local._4_4_ = cv_countA;
  local_10 = orderA;
  a._4_4_ = ON_KnotCount(orderA,cv_countA);
  if (local_10 < knotB_local._4_4_) {
    cv_countA_local = -1;
  }
  else if (knotB_local._4_4_ < local_10) {
    cv_countA_local = 1;
  }
  else if (knotA_local._4_4_ < (int)knotB_local) {
    cv_countA_local = -1;
  }
  else if ((int)knotB_local < knotA_local._4_4_) {
    cv_countA_local = 1;
  }
  else {
    bVar1 = ON_GetKnotVectorDomain(local_10,knotA_local._4_4_,_cv_countB_local,&b,&atol);
    if (bVar1) {
      dVar2 = ON_DomainTolerance(b,atol);
      bVar1 = ON_GetKnotVectorDomain(local_10,knotA_local._4_4_,_cv_countB_local,&b,&atol);
      if (bVar1) {
        local_70 = ON_DomainTolerance(b,atol);
        if (dVar2 <= local_70) {
          local_70 = dVar2;
        }
        for (a._0_4_ = 0; a._0_4_ < a._4_4_; a._0_4_ = a._0_4_ + 1) {
          b = _cv_countB_local[a._0_4_];
          atol = _i[a._0_4_];
          if ((b != atol) || (NAN(b) || NAN(atol))) {
            if (b < atol - local_70) {
              return -1;
            }
            if (atol < b - local_70) {
              return 1;
            }
            dVar2 = ON_KnotTolerance(local_10,knotA_local._4_4_,_cv_countB_local,a._0_4_);
            local_78 = ON_KnotTolerance(knotB_local._4_4_,(int)knotB_local,_i,a._0_4_);
            if (dVar2 <= local_78) {
              local_78 = dVar2;
            }
            if (b < atol - local_78) {
              return -1;
            }
            if (atol < b - local_78) {
              return 1;
            }
          }
        }
        cv_countA_local = 0;
      }
      else {
        cv_countA_local = 1;
      }
    }
    else {
      cv_countA_local = -1;
    }
  }
  return cv_countA_local;
}

Assistant:

int ON_CompareKnotVector( // returns 
                                      // -1: first < second
                                      //  0: first == second
                                      // +1: first > second
          int orderA,
          int cv_countA,
          const double* knotA,
          int orderB,
          int cv_countB,
          const double* knotB
          )
{
  const int knot_count = ON_KnotCount(orderA,cv_countA);
  int i;
  double a, b, atol, btol, ktol, tol;
  if ( orderA < orderB )
    return -1;
  if ( orderA > orderB )
    return 1;
  if ( cv_countA < cv_countB )
    return -1;
  if ( cv_countA > cv_countB )
    return 1;

  if ( !ON_GetKnotVectorDomain( orderA, cv_countA, knotA, &a, &b ) )
    return -1;
  atol = ON_DomainTolerance( a, b );
  if ( !ON_GetKnotVectorDomain( orderA, cv_countA, knotA, &a, &b ) )
    return 1;
  btol = ON_DomainTolerance( a, b );
  tol = (atol <= btol) ? atol : btol;

  for ( i = 0; i < knot_count; i++ ) {
    a = knotA[i];
    b = knotB[i];
    if ( a == b )
      continue;
    if ( a < b-tol )
      return -1;
    if ( b < a-tol )
      return 1;
    atol = ON_KnotTolerance( orderA, cv_countA, knotA, i );
    btol = ON_KnotTolerance( orderB, cv_countB, knotB, i );
    ktol = (atol <= btol) ? atol : btol;
    if ( a < b-ktol )
      return -1;
    if ( b < a-ktol )
      return 1;
  }
  return 0;
}